

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsAnalytic_mels.c
# Opt level: O0

int main(void)

{
  int iVar1;
  int iVar2;
  long netf;
  long ncfn;
  long nni;
  long nfeLS;
  long nje;
  long nsetups;
  long nfe;
  long nst;
  sunrealtype tout;
  sunrealtype t;
  void *cvode_mem;
  SUNLinearSolver LS;
  N_Vector y;
  int retval;
  sunrealtype lamda;
  sunrealtype abstol;
  sunrealtype reltol;
  sunindextype NEQ;
  sunrealtype dTout;
  sunrealtype Tf;
  sunrealtype T0;
  void *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  void *in_stack_ffffffffffffff58;
  undefined8 local_a0;
  sunrealtype in_stack_ffffffffffffff68;
  sunrealtype in_stack_ffffffffffffff70;
  sunrealtype in_stack_ffffffffffffff78;
  N_Vector in_stack_ffffffffffffff80;
  undefined8 local_78;
  void *local_70;
  double local_68;
  undefined8 local_60;
  SUNLinearSolver local_58;
  long *local_50;
  int local_44;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  double local_20;
  void *local_18;
  double local_10;
  int local_4;
  
  local_4 = 0;
  local_10 = 0.0;
  local_18 = (void *)0x4024000000000000;
  local_20 = 1.0;
  local_28 = 1;
  local_30 = 0x3eb0c6f7a0b5ed8d;
  local_38 = 0x3ddb7cdfd9d7bdbb;
  local_40 = 0xc059000000000000;
  local_50 = (long *)0x0;
  local_58 = (SUNLinearSolver)0x0;
  local_60 = 0;
  printf("\nAnalytical ODE test problem:\n");
  printf("    lamda = %g\n",local_40);
  printf("   reltol = %.1e\n",local_30);
  printf("   abstol = %.1e\n\n",local_38);
  local_44 = SUNContext_Create(0,&sunctx);
  iVar1 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                       (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  if (iVar1 == 0) {
    local_50 = (long *)N_VNew_Serial(local_28,sunctx);
    iVar1 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                         (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    if (iVar1 == 0) {
      N_VConst(0,local_50);
      local_60 = CVodeCreate(2,sunctx);
      iVar1 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                           (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
      if (iVar1 == 0) {
        local_44 = CVodeInit(local_10,local_60,f,local_50);
        iVar1 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                             (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        if (iVar1 == 0) {
          local_44 = CVodeSetUserData(local_60,&local_40);
          iVar1 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                               (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
          if (iVar1 == 0) {
            local_44 = CVodeSStolerances(local_30,local_38,local_60);
            iVar1 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                                 (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
            if (iVar1 == 0) {
              local_58 = MatrixEmbeddedLS(in_stack_ffffffffffffff48);
              iVar1 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                                   (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
              if (iVar1 == 0) {
                local_44 = CVodeSetLinearSolver(local_60,local_58,0);
                iVar1 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                                     (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
                if (iVar1 == 0) {
                  local_68 = local_10;
                  local_70 = (void *)(local_10 + local_20);
                  printf("        t           u\n");
                  printf("   ---------------------\n");
                  while (iVar1 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                        1e-15 < (double)local_18 - local_68) {
                    local_44 = CVode(local_70,local_60,local_50,&local_68,1);
                    iVar2 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,iVar1);
                    if (iVar2 != 0) break;
                    printf("  %10.6f  %10.6f\n",local_68,**(undefined8 **)(*local_50 + 0x10));
                    if (local_44 < 0) {
                      fprintf(_stderr,"Solver failure, stopping integration\n");
                      break;
                    }
                    in_stack_ffffffffffffff48 = (void *)(local_20 + (double)local_70);
                    local_70 = in_stack_ffffffffffffff48;
                    if ((double)local_18 < (double)in_stack_ffffffffffffff48) {
                      in_stack_ffffffffffffff48 = local_18;
                      local_70 = local_18;
                    }
                  }
                  printf("   ---------------------\n");
                  local_44 = CVodeGetNumSteps(local_60,&local_78);
                  check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,iVar1);
                  local_44 = CVodeGetNumRhsEvals(local_60,&stack0xffffffffffffff80);
                  check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,iVar1);
                  local_44 = CVodeGetNumLinSolvSetups(local_60,&stack0xffffffffffffff78);
                  check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,iVar1);
                  local_44 = CVodeGetNumErrTestFails(local_60,&stack0xffffffffffffff50);
                  check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,iVar1);
                  local_44 = CVodeGetNumNonlinSolvIters(local_60,&local_a0);
                  check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,iVar1);
                  local_44 = CVodeGetNumNonlinSolvConvFails(local_60,&stack0xffffffffffffff58);
                  check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,iVar1);
                  local_44 = CVodeGetNumJacEvals(local_60,&stack0xffffffffffffff70);
                  check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,iVar1);
                  local_44 = CVodeGetNumLinRhsEvals(local_60,&stack0xffffffffffffff68);
                  check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,iVar1);
                  printf("\nFinal Solver Statistics:\n");
                  printf("   Internal solver steps = %li\n",local_78);
                  printf("   Total RHS evals = %li\n",in_stack_ffffffffffffff80);
                  printf("   Total linear solver setups = %li\n",in_stack_ffffffffffffff78);
                  printf("   Total RHS evals for setting up the linear system = %li\n",
                         in_stack_ffffffffffffff68);
                  printf("   Total number of Jacobian evaluations = %li\n",in_stack_ffffffffffffff70
                        );
                  printf("   Total number of Newton iterations = %li\n",local_a0);
                  printf("   Total number of linear solver convergence failures = %li\n",
                         in_stack_ffffffffffffff58);
                  printf("   Total number of error test failures = %li\n\n",
                         in_stack_ffffffffffffff50);
                  local_44 = check_ans(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                                       in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
                  N_VDestroy(local_50);
                  CVodeFree(&local_60);
                  SUNLinSolFree(local_58);
                  SUNContext_Free(&sunctx);
                  local_4 = local_44;
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0     = SUN_RCONST(0.0);    /* initial time */
  sunrealtype Tf     = SUN_RCONST(10.0);   /* final time */
  sunrealtype dTout  = SUN_RCONST(1.0);    /* time between outputs */
  sunindextype NEQ   = 1;                  /* number of dependent vars. */
  sunrealtype reltol = SUN_RCONST(1.0e-6); /* tolerances */
  sunrealtype abstol = SUN_RCONST(1.0e-10);
  sunrealtype lamda  = SUN_RCONST(-100.0); /* stiffness parameter */

  /* general problem variables */
  int retval;                /* reusable error-checking flag */
  N_Vector y         = NULL; /* empty vector for storing solution */
  SUNLinearSolver LS = NULL; /* empty linear solver object */
  void* cvode_mem    = NULL; /* empty CVode memory structure */
  sunrealtype t, tout;
  long int nst, nfe, nsetups, nje, nfeLS, nni, ncfn, netf;

  /* Initial diagnostics output */
  printf("\nAnalytical ODE test problem:\n");
  printf("    lamda = %" GSYM "\n", lamda);
  printf("   reltol = %.1" ESYM "\n", reltol);
  printf("   abstol = %.1" ESYM "\n\n", abstol);

  /* Create the SUNDIALS simulation context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Initialize data structures */
  y = N_VNew_Serial(NEQ, sunctx); /* Create serial vector for solution */
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return 1; }
  N_VConst(SUN_RCONST(0.0), y); /* Specify initial condition */

  /* Call CVodeCreate to create the solver memory and specify the
   * Backward Differentiation Formula */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Call CVodeInit to initialize the integrator memory and specify the
   * user's right hand side function in y'=f(t,y), the inital time T0, and
   * the initial dependent variable vector y. */
  retval = CVodeInit(cvode_mem, f, T0, y);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Call CVodeSetUserData to specify the stiffness factor */
  retval = CVodeSetUserData(cvode_mem, (void*)&lamda);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Call CVodeSStolerances to specify the scalar relative and absolute tolerances */
  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Create custom matrix-embedded linear solver */
  LS = MatrixEmbeddedLS(cvode_mem);
  if (check_retval((void*)LS, "MatrixEmbeddedLS", 0)) { return 1; }

  /* Call CVodeSetLinearSolver to attach the linear solver to CVode */
  retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

  /* In loop, call CVode, print results, and test for error.
     Break out of loop when NOUT preset output times have been reached.  */
  t    = T0;
  tout = T0 + dTout;
  printf("        t           u\n");
  printf("   ---------------------\n");
  while (Tf - t > 1.0e-15)
  {
    retval = CVode(cvode_mem, tout, y, &t, CV_NORMAL); /* call integrator */
    if (check_retval(&retval, "CVode", 1)) { break; }
    printf("  %10.6" FSYM "  %10.6" FSYM "\n", t,
           NV_Ith_S(y, 0)); /* access/print solution */
    if (retval >= 0)
    { /* successful solve: update time */
      tout += dTout;
      tout = (tout > Tf) ? Tf : tout;
    }
    else
    { /* unsuccessful solve: break */
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }
  }
  printf("   ---------------------\n");

  /* Get/print some final statistics on how the solve progressed */
  retval = CVodeGetNumSteps(cvode_mem, &nst);
  check_retval(&retval, "CVodeGetNumSteps", 1);
  retval = CVodeGetNumRhsEvals(cvode_mem, &nfe);
  check_retval(&retval, "CVodeGetNumRhsEvals", 1);
  retval = CVodeGetNumLinSolvSetups(cvode_mem, &nsetups);
  check_retval(&retval, "CVodeGetNumLinSolvSetups", 1);
  retval = CVodeGetNumErrTestFails(cvode_mem, &netf);
  check_retval(&retval, "CVodeGetNumErrTestFails", 1);
  retval = CVodeGetNumNonlinSolvIters(cvode_mem, &nni);
  check_retval(&retval, "CVodeGetNumNonlinSolvIters", 1);
  retval = CVodeGetNumNonlinSolvConvFails(cvode_mem, &ncfn);
  check_retval(&retval, "CVodeGetNumNonlinSolvConvFails", 1);
  retval = CVodeGetNumJacEvals(cvode_mem, &nje);
  check_retval(&retval, "CVodeGetNumJacEvals", 1);
  retval = CVodeGetNumLinRhsEvals(cvode_mem, &nfeLS);
  check_retval(&retval, "CVodeGetNumLinRhsEvals", 1);

  printf("\nFinal Solver Statistics:\n");
  printf("   Internal solver steps = %li\n", nst);
  printf("   Total RHS evals = %li\n", nfe);
  printf("   Total linear solver setups = %li\n", nsetups);
  printf("   Total RHS evals for setting up the linear system = %li\n", nfeLS);
  printf("   Total number of Jacobian evaluations = %li\n", nje);
  printf("   Total number of Newton iterations = %li\n", nni);
  printf("   Total number of linear solver convergence failures = %li\n", ncfn);
  printf("   Total number of error test failures = %li\n\n", netf);

  /* check the solution error */
  retval = check_ans(y, t, reltol, abstol);

  /* Clean up and return */
  N_VDestroy(y);         /* Free y vector */
  CVodeFree(&cvode_mem); /* Free integrator memory */
  SUNLinSolFree(LS);     /* Free linear solver */
  SUNContext_Free(&sunctx);

  return retval;
}